

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O0

Error asmjit::X86RAPass_translateOperands(X86RAPass *self,Operand_ *opArray,uint32_t opCount)

{
  RAPass *pRVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  CBNode *pCVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint *puVar9;
  ulong uVar10;
  ulong uVar11;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  bool bVar12;
  VirtReg *vreg_2;
  VirtReg *vreg_1;
  X86Mem *m;
  VirtReg *vreg;
  Operand_ *op;
  uint32_t i;
  X86Compiler *cc;
  size_t index_4;
  size_t index_2;
  size_t index;
  size_t index_3;
  size_t index_1;
  char *in_stack_00000170;
  int in_stack_0000017c;
  char *in_stack_00000180;
  RACell *cell;
  VirtReg *in_stack_fffffffffffffda0;
  RAPass *in_stack_fffffffffffffda8;
  uint local_214;
  
  pRVar1 = *(RAPass **)(in_RDI + 8);
  local_214 = 0;
  do {
    if (in_EDX <= local_214) {
      return 0;
    }
    puVar9 = (uint *)(in_RSI + (ulong)local_214 * 0x10);
    bVar12 = false;
    if ((*puVar9 & 7) == 1) {
      bVar12 = puVar9[1] - 0x100 < 0xffffff00;
    }
    if (bVar12) {
      if (puVar9[1] == 0xffffffff) {
        DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
      }
      uVar10 = (ulong)(puVar9[1] - 0x100);
      uVar11._0_4_ = pRVar1[1]._varMapToVaListOffset;
      uVar11._4_1_ = pRVar1[1]._emitComments;
      uVar11._5_3_ = *(undefined3 *)&pRVar1[1].field_0x95;
      if (uVar11 <= uVar10) {
        DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
      }
      in_stack_fffffffffffffda0 = (VirtReg *)&pRVar1[1]._stop;
      uVar2._0_4_ = pRVar1[1]._varMapToVaListOffset;
      uVar2._4_1_ = pRVar1[1]._emitComments;
      uVar2._5_3_ = *(undefined3 *)&pRVar1[1].field_0x95;
      if (uVar2 <= uVar10) {
        DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
      }
      pCVar5 = (&(*(CBNode **)in_stack_fffffffffffffda0)->_prev)[uVar10];
      if (pCVar5 == (CBNode *)0x0) {
        DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
      }
      if (*(char *)((long)&pCVar5->_passData + 5) == -1) {
        DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
      }
      puVar9[1] = (uint)*(byte *)((long)&pCVar5->_passData + 5);
      in_stack_fffffffffffffda8 = pRVar1;
    }
    else if ((*puVar9 & 7) == 2) {
      if ((8 < (*puVar9 & 0xf8)) &&
         (uVar10._0_4_ = pRVar1[1]._varMapToVaListOffset, uVar10._4_1_ = pRVar1[1]._emitComments,
         uVar10._5_3_ = *(undefined3 *)&pRVar1[1].field_0x95, puVar9[3] - 0x100 < uVar10)) {
        if (puVar9[3] == 0xffffffff) {
          DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
        }
        uVar11 = (ulong)(puVar9[3] - 0x100);
        uVar3._0_4_ = pRVar1[1]._varMapToVaListOffset;
        uVar3._4_1_ = pRVar1[1]._emitComments;
        uVar3._5_3_ = *(undefined3 *)&pRVar1[1].field_0x95;
        if (uVar3 <= uVar11) {
          DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
        }
        uVar4._0_4_ = pRVar1[1]._varMapToVaListOffset;
        uVar4._4_1_ = pRVar1[1]._emitComments;
        uVar4._5_3_ = *(undefined3 *)&pRVar1[1].field_0x95;
        if (uVar4 <= uVar11) {
          DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
        }
        pCVar5 = (&(pRVar1[1]._stop)->_prev)[uVar11];
        if ((*puVar9 & 0x8000) == 0) {
          if (*(char *)((long)&pCVar5->_passData + 5) == -1) {
            DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
          }
          puVar9[3] = (uint)*(byte *)((long)&pCVar5->_passData + 5);
        }
        else if (pCVar5[1]._prev == (CBNode *)0x0) {
          RAPass::_newVarCell(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        }
      }
      if ((0x100 < (*puVar9 & 0x1f00)) &&
         (uVar6._0_4_ = pRVar1[1]._varMapToVaListOffset, uVar6._4_1_ = pRVar1[1]._emitComments,
         uVar6._5_3_ = *(undefined3 *)&pRVar1[1].field_0x95, puVar9[1] - 0x100 < uVar6)) {
        if (puVar9[1] == 0xffffffff) {
          DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
        }
        uVar11 = (ulong)(puVar9[1] - 0x100);
        uVar7._0_4_ = pRVar1[1]._varMapToVaListOffset;
        uVar7._4_1_ = pRVar1[1]._emitComments;
        uVar7._5_3_ = *(undefined3 *)&pRVar1[1].field_0x95;
        if (uVar7 <= uVar11) {
          DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
        }
        uVar8._0_4_ = pRVar1[1]._varMapToVaListOffset;
        uVar8._4_1_ = pRVar1[1]._emitComments;
        uVar8._5_3_ = *(undefined3 *)&pRVar1[1].field_0x95;
        if (uVar8 <= uVar11) {
          DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
        }
        puVar9[1] = (uint)*(byte *)((long)&(&(pRVar1[1]._stop)->_prev)[uVar11]->_passData + 5);
      }
    }
    local_214 = local_214 + 1;
  } while( true );
}

Assistant:

static Error X86RAPass_translateOperands(X86RAPass* self, Operand_* opArray, uint32_t opCount) {
  X86Compiler* cc = self->cc();

  // Translate variables into registers.
  for (uint32_t i = 0; i < opCount; i++) {
    Operand_* op = &opArray[i];
    if (op->isVirtReg()) {
      VirtReg* vreg = cc->getVirtRegById(op->getId());
      ASMJIT_ASSERT(vreg != nullptr);
      ASMJIT_ASSERT(vreg->getPhysId() != Globals::kInvalidRegId);
      op->_reg.id = vreg->getPhysId();
    }
    else if (op->isMem()) {
      X86Mem* m = static_cast<X86Mem*>(op);

      if (m->hasBaseReg() && cc->isVirtRegValid(m->getBaseId())) {
        VirtReg* vreg = cc->getVirtRegById(m->getBaseId());

        if (m->isRegHome()) {
          self->getVarCell(vreg);
        }
        else {
          ASMJIT_ASSERT(vreg->getPhysId() != Globals::kInvalidRegId);
          op->_mem.base = vreg->getPhysId();
        }
      }

      if (m->hasIndexReg() && cc->isVirtRegValid(m->getIndexId())) {
        VirtReg* vreg = cc->getVirtRegById(m->getIndexId());
        op->_mem.index = vreg->getPhysId();
      }
    }
  }

  return kErrorOk;
}